

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::InitializeExisting
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  GenReceiver(this,struct_def,code_ptr);
  std::__cxx11::string::operator+=((string *)code_ptr," Init(buf []byte, i flatbuffers.UOffsetT) ");
  std::__cxx11::string::operator+=((string *)code_ptr,"{\n");
  std::__cxx11::string::operator+=((string *)code_ptr,"\trcv._tab.Bytes = buf\n");
  std::__cxx11::string::operator+=((string *)code_ptr,"\trcv._tab.Pos = i\n");
  std::__cxx11::string::operator+=((string *)code_ptr,"}\n\n");
  return;
}

Assistant:

void InitializeExisting(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;

    GenReceiver(struct_def, code_ptr);
    code += " Init(buf []byte, i flatbuffers.UOffsetT) ";
    code += "{\n";
    code += "\trcv._tab.Bytes = buf\n";
    code += "\trcv._tab.Pos = i\n";
    code += "}\n\n";
  }